

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_pipe_start(nni_pipe *p)

{
  nni_pipe *p_local;
  
  if ((p->p_listener != (nni_listener *)0x0) && (p->p_dialer != (nni_dialer *)0x0)) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x602,"p->p_listener == NULL || p->p_dialer == NULL");
  }
  if ((p->p_listener == (nni_listener *)0x0) && (p->p_dialer == (nni_dialer *)0x0)) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x603,"p->p_listener != NULL || p->p_dialer != NULL");
  }
  if (p->p_listener == (nni_listener *)0x0) {
    if (p->p_dialer != (nni_dialer *)0x0) {
      dialer_start_pipe(p->p_dialer,p);
    }
  }
  else {
    listener_start_pipe(p->p_listener,p);
  }
  return;
}

Assistant:

void
nni_pipe_start(nni_pipe *p)
{
	// exactly one of these must be set.
	NNI_ASSERT(p->p_listener == NULL || p->p_dialer == NULL);
	NNI_ASSERT(p->p_listener != NULL || p->p_dialer != NULL);

	// NB: starting the pipe can actually cause the pipe
	// to be deallocated before this returns (if it is rejected)
	if (p->p_listener) {
		listener_start_pipe(p->p_listener, p);
	} else if (p->p_dialer) {
		dialer_start_pipe(p->p_dialer, p);
	}
}